

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O1

uint32_t dtl_sv_to_u32(dtl_sv_t *self,_Bool *ok)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (self == (dtl_sv_t *)0x0) {
switchD_0013e686_default:
    bVar7 = false;
    uVar5 = 0;
    goto LAB_0013e73c;
  }
  switch(self->u32Flags >> 4 & 0xf) {
  case 1:
    uVar3 = (self->pAny->val).u32;
    bVar7 = -1 < (int)uVar3;
    uVar5 = 0;
    if (bVar7) {
      uVar5 = uVar3;
    }
    goto LAB_0013e73c;
  case 2:
    uVar5 = (self->pAny->val).u32;
    break;
  case 3:
    uVar4 = (self->pAny->val).u64;
    bVar7 = uVar4 >> 0x20 == 0;
    uVar6 = 0;
    if (uVar4 < 0x100000000) {
      uVar6 = uVar4;
    }
    uVar5 = (uint)uVar6;
    goto LAB_0013e73c;
  case 4:
    uVar4 = (self->pAny->val).u64;
    uVar6 = 0;
    if (uVar4 < 0x100000000) {
      uVar6 = uVar4;
    }
    uVar5 = (uint)uVar6;
    break;
  case 5:
    fVar1 = (self->pAny->val).flt;
    bVar7 = false;
    uVar5 = 0;
    if (fVar1 < 0.0) goto LAB_0013e73c;
    uVar5 = (uint)(long)fVar1;
    break;
  case 6:
    dVar2 = (self->pAny->val).dbl;
    bVar7 = false;
    uVar5 = 0;
    if (dVar2 < 0.0) goto LAB_0013e73c;
    uVar5 = (uint)(long)dVar2;
    break;
  case 7:
    uVar5 = (uint)(self->pAny->val).cr;
    break;
  case 8:
    uVar5 = (uint)(byte)(self->pAny->val).cr;
    break;
  default:
    goto switchD_0013e686_default;
  }
  bVar7 = true;
LAB_0013e73c:
  if (ok != (_Bool *)0x0) {
    *ok = bVar7;
  }
  return uVar5;
}

Assistant:

uint32_t dtl_sv_to_u32(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   uint32_t retval = 0u;
   if(self)
   {
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         if (self->pAny->val.i32 >= 0)
         {
            retval = (uint32_t)self->pAny->val.i32;
            success = true;
         }
         break;
      case DTL_SV_U32:
         retval =  self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         if ( (self->pAny->val.i64 >= 0) && (self->pAny->val.i64 <= (int64_t)UINT32_MAX))
         {
            retval = (uint32_t)self->pAny->val.i64;
            success = true;
         }
         break;
      case DTL_SV_U64:
         if (self->pAny->val.u64 <= (uint64_t)UINT32_MAX)
         {
            retval = (uint32_t)self->pAny->val.u64;
            success = true;
         }
         success = true;
         break;
      case DTL_SV_FLT:
         if (self->pAny->val.flt >= 0.0)
         {
            retval = (uint32_t)self->pAny->val.flt;
            success = true;
         }
         break;
      case DTL_SV_DBL:
         if (self->pAny->val.dbl >= 0.0)
         {
            retval = (uint32_t)self->pAny->val.dbl;
            success = true;
         }
         break;
      case DTL_SV_BOOL:
         retval = (uint32_t) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (uint32_t)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}